

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O0

void Abc_WriteLayer(FILE *pFile,int nVars,int fSkip1)

{
  uint local_1c;
  int i;
  int fSkip1_local;
  int nVars_local;
  FILE *pFile_local;
  
  fprintf((FILE *)pFile,".model Layer%d\n",(ulong)(uint)fSkip1);
  fprintf((FILE *)pFile,".inputs");
  for (local_1c = 0; (int)local_1c < nVars; local_1c = local_1c + 1) {
    fprintf((FILE *)pFile," x%02d",(ulong)local_1c);
  }
  fprintf((FILE *)pFile,"\n");
  fprintf((FILE *)pFile,".outputs");
  for (local_1c = 0; (int)local_1c < nVars; local_1c = local_1c + 1) {
    fprintf((FILE *)pFile," y%02d",(ulong)local_1c);
  }
  fprintf((FILE *)pFile,"\n");
  if (fSkip1 != 0) {
    fprintf((FILE *)pFile,".names x00 y00\n");
    fprintf((FILE *)pFile,"1 1\n");
  }
  for (local_1c = (uint)(fSkip1 != 0); (int)(local_1c + 1) < nVars; local_1c = local_1c + 2) {
    fprintf((FILE *)pFile,".subckt Comp a=x%02d b=x%02d x=y%02d y=y%02d\n",(ulong)local_1c,
            (ulong)(local_1c + 1),(ulong)local_1c,(ulong)(local_1c + 1));
  }
  if ((int)local_1c < nVars) {
    fprintf((FILE *)pFile,".names x%02d y%02d\n",(ulong)local_1c,(ulong)local_1c);
    fprintf((FILE *)pFile,"1 1\n");
  }
  fprintf((FILE *)pFile,".end\n");
  fprintf((FILE *)pFile,"\n");
  return;
}

Assistant:

void Abc_WriteLayer( FILE * pFile, int nVars, int fSkip1 )
{
    int i;
    fprintf( pFile, ".model Layer%d\n", fSkip1 );
    fprintf( pFile, ".inputs" ); 
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " x%02d", i ); 
    fprintf( pFile, "\n" ); 
    fprintf( pFile, ".outputs" ); 
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " y%02d", i ); 
    fprintf( pFile, "\n" ); 
    if ( fSkip1 )
    {
        fprintf( pFile, ".names x00 y00\n" ); 
        fprintf( pFile, "1 1\n" ); 
        i = 1;
    }
    else
        i = 0;
    for ( ; i + 1 < nVars; i += 2 )
        fprintf( pFile, ".subckt Comp a=x%02d b=x%02d x=y%02d y=y%02d\n", i, i+1, i, i+1 );
    if ( i < nVars )
    {
        fprintf( pFile, ".names x%02d y%02d\n", i, i ); 
        fprintf( pFile, "1 1\n" ); 
    }
    fprintf( pFile, ".end\n" ); 
    fprintf( pFile, "\n" ); 
}